

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseCWL.cpp
# Opt level: O2

CWLDef * parseCWL(CWLDef *__return_storage_ptr__,string *path)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  
  *(undefined8 *)&(__return_storage_ptr__->snippets)._M_h._M_rehash_policy = 0;
  (__return_storage_ptr__->snippets)._M_h._M_buckets =
       &(__return_storage_ptr__->snippets)._M_h._M_single_bucket;
  (__return_storage_ptr__->snippets)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->snippets)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->snippets)._M_h._M_element_count = 0;
  (__return_storage_ptr__->snippets)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->environments)._M_h._M_buckets = (__buckets_ptr)0x0;
  (__return_storage_ptr__->environments)._M_h._M_bucket_count = 0;
  *(undefined8 *)&(__return_storage_ptr__->environments)._M_h._M_rehash_policy = 0;
  (__return_storage_ptr__->snippets)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->snippets)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->environments)._M_h._M_buckets =
       &(__return_storage_ptr__->environments)._M_h._M_single_bucket;
  (__return_storage_ptr__->environments)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->environments)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->environments)._M_h._M_element_count = 0;
  (__return_storage_ptr__->environments)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->commands)._M_h._M_buckets = (__buckets_ptr)0x0;
  (__return_storage_ptr__->commands)._M_h._M_bucket_count = 0;
  (__return_storage_ptr__->environments)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->environments)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)&(__return_storage_ptr__->commands)._M_h._M_rehash_policy = 0;
  (__return_storage_ptr__->commands)._M_h._M_buckets =
       &(__return_storage_ptr__->commands)._M_h._M_single_bucket;
  (__return_storage_ptr__->commands)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->commands)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->commands)._M_h._M_element_count = 0;
  (__return_storage_ptr__->commands)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->commands)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->commands)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  getFileContents(&lines,path);
  extractCommands(&commands,&lines);
  processCommands(__return_storage_ptr__,&commands);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&lines);
  return __return_storage_ptr__;
}

Assistant:

CWLDef parseCWL (const string &path) {
    CWLDef data {};
    auto lines = getFileContents(path);
    auto commands = extractCommands(lines);
    processCommands(data, commands);
    return data;
}